

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O1

void anon_unknown.dwarf_48320a::CollectMeshes
               (aiNode *node,
               multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
               *meshes)

{
  ulong uVar1;
  pair<const_aiNode_*,_unsigned_int> local_30;
  
  if (node->mNumMeshes != 0) {
    uVar1 = 0;
    do {
      local_30.second = node->mMeshes[uVar1];
      local_30.first = node;
      std::
      _Rb_tree<aiNode_const*,std::pair<aiNode_const*const,unsigned_int>,std::_Select1st<std::pair<aiNode_const*const,unsigned_int>>,std::less<aiNode_const*>,std::allocator<std::pair<aiNode_const*const,unsigned_int>>>
      ::_M_emplace_equal<std::pair<aiNode_const*,unsigned_int>>
                ((_Rb_tree<aiNode_const*,std::pair<aiNode_const*const,unsigned_int>,std::_Select1st<std::pair<aiNode_const*const,unsigned_int>>,std::less<aiNode_const*>,std::allocator<std::pair<aiNode_const*const,unsigned_int>>>
                  *)meshes,&local_30);
      uVar1 = uVar1 + 1;
    } while (uVar1 < node->mNumMeshes);
  }
  if (node->mNumChildren != 0) {
    uVar1 = 0;
    do {
      CollectMeshes(node->mChildren[uVar1],meshes);
      uVar1 = uVar1 + 1;
    } while (uVar1 < node->mNumChildren);
  }
  return;
}

Assistant:

void CollectMeshes(const aiNode* node, std::multimap<const aiNode*, unsigned int>& meshes) {
        for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
            meshes.insert(std::make_pair(node, node->mMeshes[i]));
        }
        for (unsigned int i = 0; i < node->mNumChildren; ++i) {
            CollectMeshes(node->mChildren[i], meshes);
        }
    }